

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  BYTE *local_390;
  BYTE *local_380;
  searchMax_f local_370;
  BYTE *local_368;
  BYTE *local_348;
  BYTE *local_338;
  BYTE *local_318;
  BYTE *local_308;
  BYTE *local_300;
  BYTE *local_2f0;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  int local_230;
  U32 repIndex_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  ulong uStack_1e8;
  U32 repIndex_1;
  size_t ml2;
  size_t offsetFound;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 lowestIndex;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  size_t local_130;
  void *local_128;
  U32 *local_120;
  seqStore_t *local_118;
  ZSTD_matchState_t *local_110;
  BYTE *local_108;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  int local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  ulong local_d8;
  seqStore_t *local_d0;
  BYTE *local_c8;
  BYTE *litEnd;
  BYTE *litLimit_w;
  int local_ac;
  BYTE *local_a8;
  BYTE *local_a0;
  ulong local_98;
  seqStore_t *local_90;
  BYTE *local_88;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  istart._4_4_ = 1;
  istart._0_4_ = 2;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  _lowestIndex = (ms->window).base;
  prefixStart._4_4_ = (ms->window).dictLimit;
  prefixStart._0_4_ = (ms->window).lowLimit;
  dictBase = _lowestIndex + prefixStart._4_4_;
  dictEnd = (ms->window).dictBase;
  dictStart = dictEnd + prefixStart._4_4_;
  searchMax = (searchMax_f)(dictEnd + (uint)prefixStart);
  _offset_2 = ZSTD_BtFindBestMatch_extDict_selectMLS;
  matchLength._4_4_ = *rep;
  matchLength._0_4_ = rep[1];
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == dictBase));
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_130 = srcSize;
  local_128 = src;
  local_120 = rep;
  local_118 = seqStore;
  local_110 = ms;
LAB_0015cfd2:
  do {
    if (base <= anchor) {
      *local_120 = matchLength._4_4_;
      local_120[1] = (U32)matchLength;
      return (long)ilimit - (long)iend;
    }
    offset = 0;
    start = (BYTE *)0x0;
    _repIndex = anchor + 1;
    repBase._4_4_ = (int)anchor - (int)_lowestIndex;
    repBase._0_4_ = (repBase._4_4_ + 1) - matchLength._4_4_;
    if ((uint)repBase < prefixStart._4_4_) {
      local_2f0 = dictEnd;
    }
    else {
      local_2f0 = _lowestIndex;
    }
    repMatch = local_2f0;
    repEnd = local_2f0 + (uint)repBase;
    if ((prefixStart._4_4_ - 1) - (uint)repBase < 3 || (uint)repBase <= (uint)prefixStart) {
LAB_0015d182:
      ml2 = 999999999;
      uStack_1e8 = (*_offset_2)(local_110,anchor,ilimit,&ml2);
      if (offset < uStack_1e8) {
        _repIndex = anchor;
        start = (BYTE *)ml2;
        offset = uStack_1e8;
      }
      if (offset < 4) {
        anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
        goto LAB_0015cfd2;
      }
      if ((int)istart != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          repBase._4_4_ = repBase._4_4_ + 1;
          if (start != (BYTE *)0x0) {
            repBase_1._4_4_ = repBase._4_4_ - matchLength._4_4_;
            if (repBase_1._4_4_ < prefixStart._4_4_) {
              local_308 = dictEnd;
            }
            else {
              local_308 = _lowestIndex;
            }
            repMatch_1 = local_308;
            repEnd_1 = local_308 + repBase_1._4_4_;
            if (2 < (prefixStart._4_4_ - 1) - repBase_1._4_4_ && (uint)prefixStart < repBase_1._4_4_
               ) {
              UVar2 = MEM_read32(anchor);
              UVar3 = MEM_read32(repEnd_1);
              if (UVar2 == UVar3) {
                if (repBase_1._4_4_ < prefixStart._4_4_) {
                  local_318 = dictStart;
                }
                else {
                  local_318 = ilimit;
                }
                repLength = (size_t)local_318;
                sVar5 = ZSTD_count_2segments(anchor + 4,repEnd_1 + 4,ilimit,local_318,dictBase);
                _gain1 = sVar5 + 4;
                offset2._4_4_ = (int)_gain1 * 3;
                iVar1 = (int)offset;
                UVar2 = ZSTD_highbit32((int)start + 1);
                offset2._0_4_ = (iVar1 * 3 - UVar2) + 1;
                if ((3 < _gain1) && ((int)offset2 < offset2._4_4_)) {
                  offset = _gain1;
                  start = (BYTE *)0x0;
                  _repIndex = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          _gain1_1 = (*_offset_2)(local_110,anchor,ilimit,&ml2_1);
          lVar6 = _gain1_1 << 2;
          UVar2 = ZSTD_highbit32((int)ml2_1 + 1);
          repIndex_2 = (int)lVar6 - UVar2;
          lVar6 = offset << 2;
          UVar2 = ZSTD_highbit32((int)start + 1);
          local_230 = ((int)lVar6 - UVar2) + 4;
          if ((_gain1_1 < 4) || ((int)repIndex_2 <= local_230)) {
            if (((int)istart != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            repBase._4_4_ = repBase._4_4_ + 1;
            if (start != (BYTE *)0x0) {
              repBase_2._4_4_ = repBase._4_4_ - matchLength._4_4_;
              if (repBase_2._4_4_ < prefixStart._4_4_) {
                local_338 = dictEnd;
              }
              else {
                local_338 = _lowestIndex;
              }
              repMatch_2 = local_338;
              repEnd_2 = local_338 + repBase_2._4_4_;
              if (2 < (prefixStart._4_4_ - 1) - repBase_2._4_4_ &&
                  (uint)prefixStart < repBase_2._4_4_) {
                UVar2 = MEM_read32(anchor);
                UVar3 = MEM_read32(repEnd_2);
                if (UVar2 == UVar3) {
                  if (repBase_2._4_4_ < prefixStart._4_4_) {
                    local_348 = dictStart;
                  }
                  else {
                    local_348 = ilimit;
                  }
                  repLength_1 = (size_t)local_348;
                  sVar5 = ZSTD_count_2segments(anchor + 4,repEnd_2 + 4,ilimit,local_348,dictBase);
                  _gain1_2 = sVar5 + 4;
                  offset2_1._4_4_ = (int)_gain1_2 * 4;
                  lVar6 = offset << 2;
                  UVar2 = ZSTD_highbit32((int)start + 1);
                  offset2_1._0_4_ = ((int)lVar6 - UVar2) + 1;
                  if ((3 < _gain1_2) && ((int)offset2_1 < offset2_1._4_4_)) {
                    offset = _gain1_2;
                    start = (BYTE *)0x0;
                    _repIndex = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            uVar7 = (*_offset_2)(local_110,anchor,ilimit,&ml2_2);
            UVar2 = ZSTD_highbit32((int)ml2_2 + 1);
            lVar6 = offset << 2;
            UVar3 = ZSTD_highbit32((int)start + 1);
            if ((uVar7 < 4) || ((int)((int)(uVar7 << 2) - UVar2) <= (int)(((int)lVar6 - UVar3) + 7))
               ) break;
            start = (BYTE *)ml2_2;
            _repIndex = anchor;
            offset = uVar7;
          }
          else {
            start = (BYTE *)ml2_1;
            _repIndex = anchor;
            offset = _gain1_1;
          }
        }
      }
      if (start != (BYTE *)0x0) {
        uVar4 = ((int)_repIndex - (int)_lowestIndex) - ((int)start + -2);
        if (uVar4 < prefixStart._4_4_) {
          local_368 = dictEnd + uVar4;
        }
        else {
          local_368 = _lowestIndex + uVar4;
        }
        mStart = local_368;
        if (uVar4 < prefixStart._4_4_) {
          local_370 = searchMax;
        }
        else {
          local_370 = (searchMax_f)dictBase;
        }
        while( true ) {
          bVar8 = false;
          if ((iend < _repIndex) && (bVar8 = false, local_370 < mStart)) {
            bVar8 = _repIndex[-1] == mStart[-1];
          }
          if (!bVar8) break;
          _repIndex = _repIndex + -1;
          mStart = mStart + -1;
          offset = offset + 1;
        }
        matchLength._0_4_ = matchLength._4_4_;
        matchLength._4_4_ = (int)start - 2;
      }
    }
    else {
      UVar2 = MEM_read32(anchor + 1);
      UVar3 = MEM_read32(repEnd);
      if (UVar2 != UVar3) goto LAB_0015d182;
      if ((uint)repBase < prefixStart._4_4_) {
        local_300 = dictStart;
      }
      else {
        local_300 = ilimit;
      }
      offsetFound = (size_t)local_300;
      sVar5 = ZSTD_count_2segments(anchor + 5,repEnd + 4,ilimit,local_300,dictBase);
      offset = sVar5 + 4;
      if ((int)istart != 0) goto LAB_0015d182;
    }
    local_98 = (long)_repIndex - (long)iend;
    litLimit_w = (BYTE *)(offset - 3);
    local_90 = local_118;
    local_a0 = iend;
    local_a8 = ilimit;
    local_ac = (int)start;
    litEnd = ilimit + -0x20;
    local_c8 = iend + local_98;
    if (local_118->maxNbSeq <=
        (ulong)((long)local_118->sequences - (long)local_118->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_118->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_118->litStart + local_118->maxNbLit < local_118->lit + local_98) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit < iend + local_98) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (litEnd < local_c8) {
      ZSTD_safecopyLiterals(local_118->lit,iend,local_c8,litEnd);
    }
    else {
      ZSTD_copy16(local_118->lit,iend);
      if (0x10 < local_98) {
        oend = local_90->lit + 0x10;
        op = local_a0 + 0x10;
        local_60 = local_98 - 0x10;
        diff._4_4_ = 0;
        ip_1 = oend + -(long)op;
        local_88 = oend + local_60;
        local_58 = op;
        local_50 = oend;
        if ((long)ip_1 < 8 && -0x10 < (long)ip_1) {
          __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1268,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        if ((long)ip_1 < 0x10 && -0x10 < (long)ip_1) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(oend,op);
        oend = oend + 0x10;
        op = op + 0x10;
        if (oend < local_88) {
          do {
            ZSTD_copy16(oend,op);
            oend = oend + 0x10;
            op = op + 0x10;
            ZSTD_copy16(oend,op);
            oend = oend + 0x10;
            op = op + 0x10;
          } while (oend < local_88);
        }
      }
    }
    local_90->lit = local_90->lit + local_98;
    if (0xffff < local_98) {
      if (local_90->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x204d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_90->longLengthID = 1;
      local_90->longLengthPos =
           (U32)((long)local_90->sequences - (long)local_90->sequencesStart >> 3);
    }
    local_90->sequences->litLength = (U16)local_98;
    local_90->sequences->offset = local_ac + 1;
    if ((BYTE *)0xffff < litLimit_w) {
      if (local_90->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_90->longLengthID = 2;
      local_90->longLengthPos =
           (U32)((long)local_90->sequences - (long)local_90->sequencesStart >> 3);
    }
    local_90->sequences->matchLength = (U16)litLimit_w;
    local_90->sequences = local_90->sequences + 1;
    for (anchor = _repIndex + offset; iend = anchor, anchor <= base; anchor = anchor + offset) {
      uVar4 = ((int)anchor - (int)_lowestIndex) - (U32)matchLength;
      if (uVar4 < prefixStart._4_4_) {
        local_380 = dictEnd;
      }
      else {
        local_380 = _lowestIndex;
      }
      if ((prefixStart._4_4_ - 1) - uVar4 < 3 || uVar4 <= (uint)prefixStart) break;
      UVar2 = MEM_read32(anchor);
      UVar3 = MEM_read32(local_380 + uVar4);
      if (UVar2 != UVar3) break;
      if (uVar4 < prefixStart._4_4_) {
        local_390 = dictStart;
      }
      else {
        local_390 = ilimit;
      }
      sVar5 = ZSTD_count_2segments(anchor + 4,local_380 + uVar4 + 4,ilimit,local_390,dictBase);
      uVar4 = (U32)matchLength;
      offset = sVar5 + 4;
      start = (BYTE *)(ulong)(U32)matchLength;
      matchLength._0_4_ = matchLength._4_4_;
      matchLength._4_4_ = uVar4;
      litLimit_w_1 = (BYTE *)(sVar5 + 1);
      local_d0 = local_118;
      local_d8 = 0;
      local_e0 = iend;
      local_e8 = ilimit;
      local_ec = 0;
      litEnd_1 = ilimit + -0x20;
      local_108 = iend;
      if (local_118->maxNbSeq <=
          (ulong)((long)local_118->sequences - (long)local_118->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_118->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_118->litStart + local_118->maxNbLit < local_118->lit) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit < iend) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (litEnd_1 < iend) {
        ZSTD_safecopyLiterals(local_118->lit,iend,iend,litEnd_1);
      }
      else {
        ZSTD_copy16(local_118->lit,iend);
        if (0x10 < local_d8) {
          oend_1 = local_d0->lit + 0x10;
          op_1 = local_e0 + 0x10;
          local_20 = local_d8 - 0x10;
          diff_1._4_4_ = 0;
          ip_2 = oend_1 + -(long)op_1;
          local_48 = oend_1 + local_20;
          local_18 = op_1;
          local_10 = oend_1;
          if ((long)ip_2 < 8 && -0x10 < (long)ip_2) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if ((long)ip_2 < 0x10 && -0x10 < (long)ip_2) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend_1,op_1);
          oend_1 = oend_1 + 0x10;
          op_1 = op_1 + 0x10;
          if (oend_1 < local_48) {
            do {
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
            } while (oend_1 < local_48);
          }
        }
      }
      local_d0->lit = local_d0->lit + local_d8;
      if (0xffff < local_d8) {
        if (local_d0->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthID = 1;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->litLength = (U16)local_d8;
      local_d0->sequences->offset = local_ec + 1;
      if ((BYTE *)0xffff < litLimit_w_1) {
        if (local_d0->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthID = 2;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->matchLength = (U16)litLimit_w_1;
      local_d0->sequences = local_d0->sequences + 1;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}